

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256.c
# Opt level: O3

_Bool Hacl_Bignum256_mod(uint64_t *n,uint64_t *a,uint64_t *res)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  ulong uVar11;
  _Bool _Var12;
  uint32_t i;
  int iVar13;
  ulong uVar14;
  uint64_t a_mod [4];
  uint64_t c [8];
  uint64_t local_f8 [9];
  uint64_t uStack_b0;
  uint64_t local_a8;
  uint64_t uStack_a0;
  uint64_t local_98;
  uint64_t uStack_90;
  uint64_t local_88;
  uint64_t uStack_80;
  uint64_t local_78 [9];
  
  uVar10 = *n;
  uVar1 = FStar_UInt64_eq_mask(1,uVar10);
  uVar2 = FStar_UInt64_gte_mask(1,uVar10);
  uVar8 = n[1];
  uVar14 = 0;
  uVar3 = FStar_UInt64_eq_mask(0,uVar8);
  uVar4 = FStar_UInt64_gte_mask(0,uVar8);
  uVar8 = n[2];
  uVar5 = FStar_UInt64_eq_mask(0,uVar8);
  uVar6 = FStar_UInt64_gte_mask(0,uVar8);
  uVar8 = n[3];
  uVar7 = FStar_UInt64_eq_mask(0,uVar8);
  uVar8 = FStar_UInt64_gte_mask(0,uVar8);
  uVar11 = 0;
  do {
    uVar9 = FStar_UInt64_eq_mask(n[uVar14],0);
    uVar11 = (uVar11 ^ uVar14) & uVar9 ^ uVar14;
    uVar14 = uVar14 + 1;
  } while (uVar14 != 4);
  _Var12 = (_Bool)((~(uVar8 | uVar7) |
                   (~(uVar6 | uVar5) | (~(uVar4 | uVar3) | ~(uVar2 | uVar1) & uVar3) & uVar5) &
                   uVar7) == 0xffffffffffffffff & (byte)uVar10);
  if (_Var12 == true) {
    local_f8[2] = 0;
    local_f8[3] = 0;
    local_f8[0] = 0;
    local_f8[1] = 0;
    *(byte *)(local_f8 + ((uint)uVar11 & 0x3ffffff)) = (byte)local_f8[(uint)uVar11 & 0x3ffffff] | 1;
    iVar13 = (uint)uVar11 * 0x40 + -0x200;
    if (iVar13 != 0) {
      iVar13 = -iVar13;
      do {
        Hacl_Bignum256_add_mod(n,local_f8,local_f8,local_f8);
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
    }
    uVar10 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(uVar10);
    local_f8[6] = 0;
    local_f8[7] = 0;
    local_f8[4] = 0;
    local_f8[5] = 0;
    local_f8[8] = *a;
    uStack_b0 = a[1];
    local_a8 = a[2];
    uStack_a0 = a[3];
    local_98 = a[4];
    uStack_90 = a[5];
    local_88 = a[6];
    uStack_80 = a[7];
    areduction(n,uVar10,local_f8 + 8,local_f8 + 4);
    local_78[6] = 0;
    local_78[7] = 0;
    local_78[4] = 0;
    local_78[5] = 0;
    local_78[2] = 0;
    local_78[3] = 0;
    local_78[0] = 0;
    local_78[1] = 0;
    Hacl_Bignum256_mul(local_f8 + 4,local_f8,local_78);
    reduction(n,uVar10,local_78,res);
  }
  else {
    res[2] = 0;
    res[3] = 0;
    *res = 0;
    res[1] = 0;
  }
  return _Var12;
}

Assistant:

bool Hacl_Bignum256_mod(uint64_t *n, uint64_t *a, uint64_t *res)
{
  uint64_t one[4U] = { 0U };
  memset(one, 0U, 4U * sizeof (uint64_t));
  one[0U] = 1ULL;
  uint64_t bit0 = n[0U] & 1ULL;
  uint64_t m0 = 0ULL - bit0;
  uint64_t acc = 0ULL;
  KRML_MAYBE_FOR4(i,
    0U,
    4U,
    1U,
    uint64_t beq = FStar_UInt64_eq_mask(one[i], n[i]);
    uint64_t blt = ~FStar_UInt64_gte_mask(one[i], n[i]);
    acc = (beq & acc) | (~beq & ((blt & 0xFFFFFFFFFFFFFFFFULL) | (~blt & 0ULL))););
  uint64_t m1 = acc;
  uint64_t is_valid_m = m0 & m1;
  uint32_t nBits = 64U * (uint32_t)Hacl_Bignum_Lib_bn_get_top_index_u64(4U, n);
  if (is_valid_m == 0xFFFFFFFFFFFFFFFFULL)
  {
    uint64_t r2[4U] = { 0U };
    precompr2(nBits, n, r2);
    uint64_t mu = Hacl_Bignum_ModInvLimb_mod_inv_uint64(n[0U]);
    bn_slow_precomp(n, mu, r2, a, res);
  }
  else
  {
    memset(res, 0U, 4U * sizeof (uint64_t));
  }
  return is_valid_m == 0xFFFFFFFFFFFFFFFFULL;
}